

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O1

LispPTR Unix_handlecomm(LispPTR *args)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  LispPTR LVar4;
  int iVar5;
  __pid_t __pgrp;
  ssize_t sVar7;
  int *piVar8;
  size_t sVar9;
  char *pcVar10;
  uint *puVar11;
  DLword *pDVar12;
  LispPTR unaff_EBX;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  uchar d [6];
  unsigned_short len;
  uchar ch;
  undefined4 local_b8;
  undefined2 local_b4;
  undefined2 local_b2;
  long local_b0;
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined6 uStack_50;
  undefined2 uStack_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  long lVar6;
  
  uVar17 = *args;
  if ((uVar17 & 0xfff0000) == 0xf0000) {
    uVar17 = uVar17 | 0xffff0000;
  }
  else if ((uVar17 & 0xfff0000) == 0xe0000) {
    uVar17 = uVar17 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar17 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    uVar17 = *(uint *)(Lisp_world + uVar17);
  }
  switch(uVar17) {
  case 0:
    uVar17 = socket(1,1,0);
    if (-1 < (int)uVar17) {
      sprintf(build_socket_pathname::PathName,"/tmp/LPU%ld-%d",StartTime,(ulong)uVar17);
      local_a8.sa_data[6] = '\0';
      local_a8.sa_data[7] = '\0';
      local_a8.sa_data[8] = '\0';
      local_a8.sa_data[9] = '\0';
      local_a8.sa_data[10] = '\0';
      local_a8.sa_data[0xb] = '\0';
      local_a8.sa_data[0xc] = '\0';
      local_a8.sa_data[0xd] = '\0';
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      uStack_4a = 0;
      uStack_48 = 0;
      uStack_42 = 0;
      local_a8.sa_family = 1;
      local_a8.sa_data[0] = '\0';
      local_a8.sa_data[1] = '\0';
      local_a8.sa_data[2] = '\0';
      local_a8.sa_data[3] = '\0';
      local_a8.sa_data[4] = '\0';
      local_a8.sa_data[5] = '\0';
      strcpy(local_a8.sa_data,build_socket_pathname::PathName);
      iVar5 = bind(uVar17,&local_a8,0x6e);
      if (iVar5 < 0) {
        Unix_handlecomm_cold_2();
        return 0;
      }
      iVar5 = listen(uVar17,1);
      if (iVar5 < 0) {
        perror("Listen");
      }
      local_b4 = 0;
      local_b8 = CONCAT13((char)uVar17,0x46);
      write(UnixPipeOut,&local_b8,6);
      WriteLispStringToPipe(args[1]);
      iVar5 = UnixPipeIn;
      sVar7 = read(UnixPipeIn,&local_b8,6);
      if (sVar7 < 0) {
        piVar8 = __errno_location();
        do {
          if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
            perror("reading UnixPipeIn");
            break;
          }
          sVar7 = read(iVar5,&local_b8,6);
        } while (sVar7 < 0);
      }
      if (local_b8._3_1_ != '\x01') {
        close(uVar17);
        unlink(build_socket_pathname::PathName);
        return 0;
      }
      do {
        alarm(TIMEOUT_TIME);
        piVar8 = __errno_location();
        do {
          *piVar8 = 0;
          uVar15 = accept(uVar17,(sockaddr *)0x0,(socklen_t *)0x0);
          if (uVar15 != 0xffffffff) break;
        } while (*piVar8 == 4);
        alarm(0);
        if (-1 < (int)uVar15) {
          uVar3 = fcntl(uVar15,3,0);
          iVar5 = fcntl(uVar15,4,(ulong)(uVar3 | 0x800));
          if (iVar5 != -1) {
            uVar14 = (ulong)uVar15;
            UJ[uVar14].type = UJPROCESS;
            UJ[uVar14].status = -1;
            UJ[uVar14].PID =
                 CONCAT13(local_b4._1_1_,
                          CONCAT12((byte)local_b4,local_b8._1_2_ << 8 | local_b8._1_2_ >> 8));
            close(uVar17);
            unlink(build_socket_pathname::PathName);
            LVar4 = GetSmallp(uVar14);
            return LVar4;
          }
          pcVar10 = "setting up fifo to nodelay";
          goto LAB_00138e0b;
        }
      } while (*piVar8 == 4);
      perror("Accept.");
      close(uVar17);
      iVar5 = unlink(build_socket_pathname::PathName);
      if (-1 < iVar5) {
        return 0;
      }
      pcVar10 = "Unlink";
      goto LAB_00138e0b;
    }
    goto LAB_00138e04;
  case 1:
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
    }
    else if ((uVar17 & 0xfff0000) == 0xe0000) {
      uVar17 = uVar17 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar17 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
      }
      uVar17 = *(uint *)(Lisp_world + uVar17);
    }
    uVar15 = args[2];
    uVar14 = (ulong)uVar15;
    if ((uVar15 & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((*(ushort *)((ulong)(uVar15 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar15 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar15);
      }
      uVar14 = (ulong)*(uint *)(Lisp_world + uVar14);
    }
    local_a8.sa_family._0_1_ = (char)uVar14;
    if ((-1 < (int)uVar17) && ((int)uVar17 < NPROCS)) {
      if ((UJ[uVar17].type != UJUNUSED) &&
         ((UJ[uVar17].status == -1 && (uVar15 = UJ[uVar17].type + 4, uVar15 < 5)))) {
        if ((0xdU >> (uVar15 & 0x1f) & 1) == 0) {
          return 0;
        }
        sVar7 = write(uVar17,&local_a8,1);
        if ((int)sVar7 != 0) {
          return 0xe0001;
        }
        wait_for_comm_processes();
      }
    }
    break;
  case 2:
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
    }
    else if ((uVar17 & 0xfff0000) == 0xe0000) {
      uVar17 = uVar17 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar17 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
      }
      uVar17 = *(uint *)(Lisp_world + uVar17);
    }
    if ((int)uVar17 < 0) {
      return 0;
    }
    if (NPROCS <= (int)uVar17) {
      return 0;
    }
    uVar15 = UJ[uVar17].type + 4;
    if (uVar15 < 5) {
      if ((0xdU >> (uVar15 & 0x1f) & 1) == 0) {
        return 0;
      }
      alarm(TIMEOUT_TIME);
      piVar8 = __errno_location();
      do {
        *piVar8 = 0;
        sVar7 = read(uVar17,&local_a8,1);
        iVar5 = (int)sVar7;
        if (iVar5 != -1) break;
      } while (*piVar8 == 4);
      alarm(0);
      if (iVar5 < 1) {
        wait_for_comm_processes();
        if ((iVar5 == 0) && (UJ[uVar17].status == -1)) {
          return 0x4c;
        }
        if (UJ[uVar17].status != -1) {
          return 0;
        }
        if (*piVar8 != 0xb) {
          return 0;
        }
        return 0x4c;
      }
      uVar14 = local_a8._0_8_ & 0xff;
      goto LAB_00138c57;
    }
  case 3:
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
    }
    else if ((uVar17 & 0xfff0000) == 0xe0000) {
      uVar17 = uVar17 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar17 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
      }
      uVar17 = *(uint *)(Lisp_world + uVar17);
    }
    if ((int)uVar17 < 0) {
      return 0x4c;
    }
    if (NPROCS <= (int)uVar17) {
      return 0x4c;
    }
    if (UJ[uVar17].type == UJUNUSED) {
      return 0x4c;
    }
    close(uVar17);
    if ((uint)(UJ[uVar17].type + ~UJSOCKET) < 2) {
      iVar5 = 10;
      do {
        wait_for_comm_processes();
        if (UJ[uVar17].status != -1) break;
        usleep(10000);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      if (UJ[uVar17].status == -1) {
        iVar5 = 9;
        kill(UJ[uVar17].PID,9);
        do {
          wait_for_comm_processes();
          usleep(10000);
          bVar18 = iVar5 != 0;
          iVar5 = iVar5 + -1;
          if (UJ[uVar17].status != -1) break;
        } while (bVar18);
      }
    }
    else if ((UJ[uVar17].type == UJSOCKET) && (UJ[uVar17].pathname != (char *)0x0)) {
      iVar5 = unlink(UJ[uVar17].pathname);
      if (iVar5 < 0) {
        perror("Kill 3 unlink");
      }
      free(UJ[uVar17].pathname);
      UJ[uVar17].pathname = (char *)0x0;
    }
    UJ[uVar17].type = UJUNUSED;
    UJ[uVar17].PID = 0;
    UJ[uVar17].pathname = (char *)0x0;
    uVar14 = (ulong)UJ[uVar17].status;
LAB_00138c57:
    LVar4 = GetSmallp(uVar14);
    return LVar4;
  case 4:
  case 0xb:
    uVar15 = posix_openpt(2);
    if ((int)uVar15 < 0) {
      perror("open_pt failed");
      uVar14 = 0xffffffff;
    }
    else {
      uVar14 = (ulong)uVar15;
      grantpt(uVar15);
      unlockpt(uVar15);
      pcVar10 = ptsname(uVar15);
      strcpy((char *)&local_a8,pcVar10);
      uVar3 = fcntl(uVar15,3,0);
      fcntl(uVar15,4,(ulong)(uVar3 | 0x800));
    }
    uVar15 = (uint)uVar14;
    if ((int)uVar15 < 0) {
      puts("Open of lisp side of PTY failed.");
      fflush(_stdout);
      return 0;
    }
    local_b8._0_3_ = CONCAT21(local_a8.sa_family,(uVar17 == 4) * '\x03' + 'P');
    local_b8 = CONCAT13((char)uVar14,(undefined3)local_b8);
    local_b4 = 0;
    write(UnixPipeOut,&local_b8,6);
    sVar9 = strlen((char *)&local_a8);
    uVar3 = (int)sVar9 + 1;
    local_b2 = (undefined2)uVar3;
    write(UnixPipeOut,&local_b2,2);
    write(UnixPipeOut,&local_a8,(ulong)(uVar3 & 0xffff));
    if (uVar17 != 4) {
      WriteLispStringToPipe(args[1]);
      WriteLispStringToPipe(args[2]);
    }
    iVar5 = UnixPipeIn;
    sVar7 = read(UnixPipeIn,&local_b8,6);
    if (sVar7 < 0) {
      piVar8 = __errno_location();
      do {
        if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
          perror("reading UnixPipeIn");
          break;
        }
        sVar7 = read(iVar5,&local_b8,6);
      } while (sVar7 < 0);
    }
    uVar17 = local_b8 >> 0x18;
    if (uVar17 != 1) {
      puts("Fork failed.");
      fflush(_stdout);
      printf("d = %d, %d, %d, %d, %d, %d\n",(ulong)(byte)local_b8,(ulong)local_b8._1_1_,
             (ulong)local_b8._2_1_,(ulong)uVar17,(ulong)(byte)local_b4,(uint)local_b4._1_1_);
      close(uVar15);
      return 0;
    }
    uVar17 = fcntl(uVar15,3,0);
    fcntl(uVar15,4,(ulong)(uVar17 | 0x800));
    UJ[uVar14].type = UJSHELL;
    UJ[uVar14].PID =
         CONCAT13(local_b4._1_1_,CONCAT12((byte)local_b4,local_b8._1_2_ << 8 | local_b8._1_2_ >> 8))
    ;
    printf("Shell job %d, PID = %d\n",uVar14,(ulong)(uint)UJ[uVar14].PID);
    UJ[uVar14].status = -1;
    goto LAB_001389bc;
  case 5:
    close_unix_descriptors();
    return 0x4c;
  case 6:
    local_b4 = 0;
    local_b8 = 0x43;
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
    }
    else if ((uVar17 & 0xfff0000) == 0xe0000) {
      uVar17 = uVar17 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar17 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
      }
      uVar17 = *(uint *)(Lisp_world + uVar17);
    }
    local_b8._0_2_ = CONCAT11((char)uVar17,(byte)local_b8);
    local_b8 = CONCAT13(1,(undefined3)local_b8);
    write(UnixPipeOut,&local_b8,6);
    iVar5 = UnixPipeIn;
    sVar7 = read(UnixPipeIn,&local_b8,6);
    if (sVar7 < 0) {
      piVar8 = __errno_location();
      do {
        if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
          perror("reading UnixPipeIn");
          break;
        }
        sVar7 = read(iVar5,&local_b8,6);
      } while (sVar7 < 0);
    }
    switch(UJ[(int)uVar17].type) {
    case UJSOSTREAM:
    case UJPROCESS:
    case UJSHELL:
      close(uVar17);
      break;
    case UJSOCKET:
      close(uVar17);
      if (UJ[(int)uVar17].pathname != (char *)0x0) {
        unlink(UJ[(int)uVar17].pathname);
        free(UJ[(int)uVar17].pathname);
        UJ[(int)uVar17].pathname = (char *)0x0;
      }
    }
    UJ[(int)uVar17].type = UJUNUSED;
    UJ[(int)uVar17].PID = 0;
    return 0x4c;
  case 7:
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
    }
    else if ((uVar17 & 0xfff0000) == 0xe0000) {
      uVar17 = uVar17 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar17 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
      }
      uVar17 = *(uint *)(Lisp_world + uVar17);
    }
    wait_for_comm_processes();
    uVar15 = UJ[(int)uVar17].status;
    if (uVar15 == 0xffffffff) {
      return 0x4c;
    }
    if ((int)uVar15 < 0) {
      if (-0x10001 < (int)uVar15) {
        return uVar15 & 0xffff | 0xf0000;
      }
      goto LAB_00138dd8;
    }
LAB_001389bc:
    if (uVar15 < 0x10000) {
      return uVar15 | 0xe0000;
    }
LAB_00138dd8:
    error("Not Smallp data");
    return 0xe0000;
  case 8:
    return 0xe000f;
  case 9:
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
LAB_001388b0:
      unaff_EBX = 0;
      LVar4 = 0;
      iVar5 = 1;
      if ((-1 < (int)uVar17) && ((int)uVar17 < NPROCS)) {
        uVar15 = UJ[uVar17].type + 4;
        if (uVar15 < 5) {
          if ((0xdU >> (uVar15 & 0x1f) & 1) != 0) {
            pDVar12 = Lisp_world + args[2];
            sVar7 = read(uVar17,pDVar12,0x200);
            word_swap_page(pDVar12,0x80);
            uVar15 = (uint)sVar7;
            if ((int)uVar15 < 1) {
              wait_for_comm_processes();
              if (uVar15 != 0) {
                puVar11 = (uint *)__errno_location();
                unaff_EBX = LVar4;
                if ((0xb < *puVar11) || ((0x811U >> (*puVar11 & 0x1f) & 1) == 0)) goto LAB_00138eb1;
              }
              unaff_EBX = LVar4;
              if (UJ[uVar17].status == -1) {
                unaff_EBX = 0x4c;
              }
            }
            else {
              unaff_EBX = GetSmallp((ulong)(uVar15 & 0x7fffffff));
            }
          }
        }
        else {
          iVar5 = 0;
          unaff_EBX = LVar4;
        }
      }
    }
    else {
      if ((uVar17 & 0xfff0000) == 0xe0000) {
        uVar17 = uVar17 & 0xffff;
        goto LAB_001388b0;
      }
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
        if ((uVar17 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
        }
        uVar17 = *(uint *)(Lisp_world + uVar17);
        goto LAB_001388b0;
      }
      iVar5 = 5;
    }
LAB_00138eb1:
    if (iVar5 == 5) {
      return 0;
    }
    if (iVar5 != 0) {
      return unaff_EBX;
    }
    goto LAB_00138ec2;
  case 10:
LAB_00138ec2:
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
LAB_00138f3c:
      uVar15 = args[2];
      uVar14 = (ulong)uVar15;
      if ((uVar15 & 0xfff0000 | 0x10000) != 0xf0000) {
        bVar18 = true;
        if ((*(ushort *)((ulong)(uVar15 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
        goto LAB_00139161;
        if ((uVar15 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar14);
        }
        uVar14 = (ulong)*(uint *)(Lisp_world + uVar14);
      }
      uVar15 = args[3];
      uVar16 = (ulong)uVar15;
      if ((uVar15 & 0xfff0000 | 0x10000) != 0xf0000) {
        bVar18 = true;
        if ((*(ushort *)((ulong)(uVar15 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
        goto LAB_00139161;
        if ((uVar15 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar16);
        }
        uVar16 = (ulong)*(uint *)(Lisp_world + uVar16);
      }
      bVar18 = false;
      if ((int)uVar17 < 0) {
LAB_0013915f:
        bVar18 = false;
        unaff_EBX = 0;
      }
      else {
        unaff_EBX = 0;
        if ((int)uVar17 < NPROCS) {
          bVar18 = false;
          if ((UJ[uVar17].type == UJSHELL) && (bVar18 = false, UJ[uVar17].status == -1)) {
            local_a8.sa_data._0_2_ = (short)uVar16;
            local_a8.sa_family = (short)uVar14;
            local_a8.sa_data._2_4_ = 0;
            iVar5 = ioctl(uVar17,0x5414);
            if ((iVar5 < 0) ||
               ((__pgrp = tcgetpgrp(uVar17), __pgrp < 0 || (iVar5 = killpg(__pgrp,0x1c), iVar5 < 0))
               )) {
              piVar8 = __errno_location();
              uVar14 = (ulong)*piVar8;
LAB_00139107:
              unaff_EBX = GetSmallp(uVar14);
            }
            else {
              unaff_EBX = 0x4c;
            }
LAB_0013910e:
            bVar18 = false;
          }
        }
      }
    }
    else {
      if ((uVar17 & 0xfff0000) == 0xe0000) {
        uVar17 = uVar17 & 0xffff;
        goto LAB_00138f3c;
      }
      bVar18 = true;
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
        if ((uVar17 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
        }
        uVar17 = *(uint *)(Lisp_world + uVar17);
        goto LAB_00138f3c;
      }
    }
LAB_00139161:
    if (!bVar18) {
      return unaff_EBX;
    }
    break;
  case 0xc:
    uVar17 = socket(1,1,0);
    if (-1 < (int)uVar17) {
      uVar15 = args[1];
      if ((uVar15 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar15);
      }
      pDVar12 = Lisp_world;
      iVar5 = *(int *)(Lisp_world + (ulong)uVar15 + 4);
      iVar2 = 0x800;
      if (iVar5 < 0x800) {
        iVar2 = iVar5;
      }
      lVar6 = (long)iVar2;
      if ((char)Lisp_world[(ulong)uVar15 + 3] == 'D') {
        if (iVar5 == 0) {
          pcVar10 = shcom;
        }
        else {
          lVar6 = lVar6 + (ulong)(lVar6 == 0);
          pDVar12 = Lisp_world +
                    (ulong)Lisp_world[(ulong)uVar15 + 2] +
                    (ulong)(*(uint *)(Lisp_world + uVar15) & 0xfffffff);
          pcVar10 = shcom;
          do {
            *pcVar10 = *(char *)((ulong)pDVar12 ^ 2);
            pcVar10 = pcVar10 + 1;
            pDVar12 = pDVar12 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        *pcVar10 = '\0';
      }
      else if ((char)Lisp_world[(ulong)uVar15 + 3] == 'C') {
        if (iVar5 != 0) {
          uVar3 = *(uint *)(Lisp_world + uVar15);
          uVar1 = Lisp_world[(ulong)uVar15 + 2];
          lVar13 = 0;
          do {
            shcom[lVar13] =
                 *(char *)((long)pDVar12 + lVar13 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^
                          3);
            lVar13 = lVar13 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != lVar13);
        }
        shcom[lVar6] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      sVar9 = strlen(shcom);
      pcVar10 = (char *)malloc(sVar9 + 1);
      UJ[uVar17].pathname = pcVar10;
      strcpy(UJ[uVar17].pathname,shcom);
      local_a8.sa_family = 1;
      strcpy(local_a8.sa_data,shcom);
      iVar5 = bind(uVar17,&local_a8,0x6e);
      if (iVar5 < 0) {
        Unix_handlecomm_cold_1();
        return 0;
      }
      iVar5 = listen(uVar17,1);
      if (iVar5 < 0) {
        perror("Listen");
      }
      uVar15 = fcntl(uVar17,3,0);
      fcntl(uVar17,4,(ulong)(uVar15 | 0x800));
      UJ[uVar17].status = -1;
      UJ[uVar17].PID = -1;
      UJ[uVar17].type = UJSOCKET;
      if (uVar17 < 0x10000) {
        return uVar17 | 0xe0000;
      }
      goto LAB_00138dd8;
    }
LAB_00138e04:
    pcVar10 = "socket open";
LAB_00138e0b:
    perror(pcVar10);
    return 0;
  case 0xd:
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
    }
    else if ((uVar17 & 0xfff0000) == 0xe0000) {
      uVar17 = uVar17 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
LAB_0013885b:
        bVar18 = true;
        goto LAB_00139161;
      }
      if ((uVar17 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
      }
      uVar17 = *(uint *)(Lisp_world + uVar17);
    }
    bVar18 = false;
    unaff_EBX = 0;
    if (UJ[(int)uVar17].type == UJSOCKET) {
      if (UJ[(int)uVar17].pathname == (char *)0x0) goto LAB_0013915f;
      do {
        alarm(TIMEOUT_TIME);
        piVar8 = __errno_location();
        do {
          *piVar8 = 0;
          uVar15 = accept(uVar17,(sockaddr *)0x0,(socklen_t *)0x0);
          if (uVar15 != 0xffffffff) break;
        } while (*piVar8 == 4);
        alarm(0);
        if (-1 < (int)uVar15) {
          uVar14 = (ulong)uVar15;
          UJ[uVar14].status = -1;
          UJ[uVar14].PID = -1;
          UJ[uVar14].type = UJSOSTREAM;
          goto LAB_00139107;
        }
      } while (*piVar8 == 4);
      if (*piVar8 != 0xb) {
        perror("Lisp socket accept");
        goto LAB_0013915f;
      }
      unaff_EBX = 0xfffff;
      goto LAB_0013910e;
    }
    goto LAB_00139161;
  case 0xe:
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
    }
    else if ((uVar17 & 0xfff0000) == 0xe0000) {
      uVar17 = uVar17 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_0013885b;
      if ((uVar17 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
      }
      uVar17 = *(uint *)(Lisp_world + uVar17);
    }
    bVar18 = false;
    if ((int)uVar17 < 0) goto LAB_0013915f;
    unaff_EBX = 0;
    if (NPROCS <= (int)uVar17) goto LAB_00139161;
    uVar14 = (ulong)UJ[uVar17].type;
    if (uVar14 == 0) goto LAB_0013915f;
    goto LAB_00139107;
  case 0xf:
    uVar17 = args[1];
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
LAB_0013830c:
      unaff_EBX = 0x158a28;
      pDVar12 = Lisp_world + args[2];
      uVar15 = args[3];
      if ((uVar15 & 0xfff0000) == 0xf0000) {
        uVar15 = uVar15 | 0xffff0000;
      }
      else if ((uVar15 & 0xfff0000) == 0xe0000) {
        uVar15 = uVar15 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(uVar15 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
        goto LAB_00138b54;
        if ((uVar15 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar15);
        }
        uVar15 = *(uint *)(Lisp_world + uVar15);
      }
      local_b0 = (long)(int)uVar17 * 3;
      uVar3 = UJ[(int)uVar17].type + 4;
      if (uVar3 < 5) {
        iVar5 = 1;
        unaff_EBX = 0;
        if ((0xdU >> (uVar3 & 0x1f) & 1) != 0) {
          uVar3 = (int)(uVar15 + 3) >> 2;
          word_swap_page(pDVar12,uVar3);
          sVar7 = write(uVar17,pDVar12,(long)(int)uVar15);
          word_swap_page(pDVar12,uVar3);
          uVar17 = (uint)sVar7;
          if ((int)uVar17 < 1) {
            wait_for_comm_processes();
            if (((uVar17 == 0) || (piVar8 = __errno_location(), *piVar8 == 0xb)) &&
               (unaff_EBX = 0, (&UJ->status)[local_b0 * 2] == -1)) {
              unaff_EBX = 0x4c;
            }
          }
          else {
            unaff_EBX = GetSmallp((ulong)(uVar17 & 0x7fffffff));
          }
        }
      }
      else {
        iVar5 = 0;
      }
    }
    else {
      if ((uVar17 & 0xfff0000) == 0xe0000) {
        uVar17 = uVar17 & 0xffff;
        goto LAB_0013830c;
      }
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
        if ((uVar17 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
        }
        uVar17 = *(uint *)(Lisp_world + uVar17);
        goto LAB_0013830c;
      }
LAB_00138b54:
      iVar5 = 5;
    }
    if ((iVar5 != 5) && (iVar5 != 0)) {
      return unaff_EBX;
    }
  }
  return 0;
}

Assistant:

LispPTR Unix_handlecomm(LispPTR *args) {
  int command, dest, slot;
  unsigned char d[6];
  unsigned char ch;
  unsigned char buf[1];

  /* Get command */
  N_GETNUMBER(args[0], command, bad);
  DBPRINT(("\nUnix_handlecomm: command %d\n", command));

  switch (command) {
    case 0: /* Fork pipe process */
    {
      char *PipeName;
      int PipeFD, sockFD;

      /* First create the socket */
      struct sockaddr_un sock;
      sockFD = socket(AF_UNIX, SOCK_STREAM, 0);
      if (sockFD < 0) {
        perror("socket open");
        return (NIL);
      }

      /* then bind it to a canonical pathname */
      PipeName = build_socket_pathname(sockFD);
      memset(&sock, 0, sizeof(sock));
      sock.sun_family = AF_UNIX;
      strcpy(sock.sun_path, PipeName);
      if (bind(sockFD, (struct sockaddr *)&sock, sizeof(struct sockaddr_un)) < 0) {
        close(sockFD);
        perror("binding sockets");
        unlink(PipeName);
        return (NIL);
      }

      DBPRINT(("Socket %d bound to name %s.\n", sockFD, PipeName));

      if (listen(sockFD, 1) < 0) perror("Listen");

      memset(d, 0, sizeof(d));
      d[0] = 'F';
      d[3] = sockFD;
      write(UnixPipeOut, d, 6);
      WriteLispStringToPipe(args[1]);

      DBPRINT(("Sending cmd string: %s\n", shcom));

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      /* If it worked, return job # */
      if (d[3] == 1) {
      case0_lp:
        TIMEOUT(PipeFD = accept(sockFD, NULL, NULL));
        if (PipeFD < 0) {
          if (errno == EINTR) goto case0_lp;
          perror("Accept.");
          close(sockFD);
          if (unlink(PipeName) < 0) perror("Unlink");
          return (NIL);
        }
        if (fcntl(PipeFD, F_SETFL, fcntl(PipeFD, F_GETFL, 0) | O_NONBLOCK) == -1) {
          perror("setting up fifo to nodelay");
          return (NIL);
        }
        UJ[PipeFD].type = UJPROCESS;
        UJ[PipeFD].status = -1;
        UJ[PipeFD].PID = (d[1] << 8) | d[2] | (d[4] << 16) | (d[5] << 24);
        close(sockFD);
        unlink(PipeName);
        DBPRINT(("New process: slot/PipeFD %d PID %d\n", PipeFD, UJ[PipeFD].PID));
        return (GetSmallp(PipeFD));
      } else {
        DBPRINT(("Fork request failed."));
        close(sockFD);
        unlink(PipeName);
        return (NIL);
      }
    }

    case 1: /* Write byte */
      /* Get job #, Byte */
      N_GETNUMBER(args[1], slot, bad);
      N_GETNUMBER(args[2], dest, bad);
      ch = dest; /* ch is a char */

      if (valid_slot(slot) && (UJ[slot].status == -1)) switch (UJ[slot].type) {
          case UJPROCESS:
          case UJSHELL:
          case UJSOSTREAM:
            dest = write(slot, &ch, 1);
            if (dest == 0) {
              wait_for_comm_processes();
              return (NIL);
            } else
              return (GetSmallp(1));

	  case UJSOCKET:
	  case UJUNUSED:
	    return (NIL);
        }
      break;

    case 2: /* Read byte */
      /**********************************************************/
      /* 							    */
      /* NB that it is possible for the other end of the stream */
      /* to have terminated, and hence status != -1.	    */
      /* EVEN IF THERE ARE STILL CHARACTERS TO READ.	    */
      /* 							    */
      /**********************************************************/

      N_GETNUMBER(args[1], slot, bad); /* Get job # */

      if (!valid_slot(slot)) return (NIL); /* No fd open; punt the read */
      switch (UJ[slot].type) {
        case UJPROCESS:
        case UJSHELL:
        case UJSOSTREAM:
          TIMEOUT(dest = read(slot, buf, 1));
          if (dest > 0) return (GetSmallp(buf[0]));
          /* Something's amiss; check our process status */
          wait_for_comm_processes();
          if ((dest == 0) &&
              (UJ[slot].status == -1)) { /* No available chars, but other guy still running */
            DBPRINT(("dest = 0, status still -1\n"));
            return (ATOM_T);
          }
          if ((UJ[slot].status == -1) &&
              ((errno == EWOULDBLOCK) ||
               (errno == EAGAIN))) { /* No available chars, but other guy still running */
            DBPRINT((" dest<0, EWOULDBLOCK\n"));
            return (ATOM_T);
          }
          /* At this point, we either got an I/O error, or there */
          /* were no chars available and the other end has terminated. */
          /* Either way, signal EOF. */
          DBPRINT(("Indicating EOF from PTY desc %d.\n", slot));
          return (NIL);

	case UJSOCKET:
	case UJUNUSED:
	    return (NIL);
      }

    case 3: /* Kill process */
            /* Maiko uses this as CLOSEF, so "process" is a misnomer */

      N_GETNUMBER(args[1], slot, bad);

      DBPRINT(("Terminating process in slot %d.\n", slot));
      if (!valid_slot(slot)) return (ATOM_T);
      /* in all cases we need to close() the file descriptor */
      if (slot == 0) DBPRINT(("ZERO SLOT\n"));
      close(slot);
      switch (UJ[slot].type) {
      case UJSHELL:
      case UJPROCESS:
        /* wait for up to 0.1s for it to exit on its own after the close() */
        for (int i = 0; i < 10; i++) {
          wait_for_comm_processes();
          if (UJ[slot].status != -1) break;
          usleep(10000);
        }
        /* check again before we terminate it */
        if (UJ[slot].status != -1) break;
        kill(UJ[slot].PID, SIGKILL);
        for (int i = 0; i < 10; i++) {
          /* Waiting for the process to exit is possibly risky.
             Sending SIGKILL is always supposed to kill
             a process, but on very rare occurrences this doesn't
             happen because of a Unix kernel bug, usually a user-
             written device driver which hasn't been fully
             debugged.  So we time it out just be safe. */
          wait_for_comm_processes();
          usleep(10000);
          if (UJ[slot].status != -1) break;
        }
        break;
      case UJSOCKET:
        if (UJ[slot].pathname) {
          DBPRINT(("Unlinking %s\n", UJ[slot].pathname));
          if (unlink(UJ[slot].pathname) < 0) perror("Kill 3 unlink");
          free(UJ[slot].pathname);
          UJ[slot].pathname = NULL;
        }
        break;
      case UJSOSTREAM:
      case UJUNUSED:
	break;
      }
      UJ[slot].type = UJUNUSED;
      UJ[slot].PID = 0;
      UJ[slot].pathname = NULL;

      /* If status available, return it, otherwise T */
      return (GetSmallp(UJ[slot].status));

    case 4:
    case 11: /* Fork PTY process */
    {
      char SlavePTY[32];
      int Master;
      unsigned short len;

      Master = FindAvailablePty(SlavePTY);
      DBPRINT(("Fork Shell; Master PTY = %d. Slave=%c%c.\n", Master, SlavePTY[0], SlavePTY[1]));
      if (Master < 0) {
        printf("Open of lisp side of PTY failed.\n");
        fflush(stdout);
        return (NIL);
      }

      d[0] = (command == 4) ? 'S' : 'P';
      d[1] = SlavePTY[0];
      d[2] = SlavePTY[1];
      d[3] = Master;
      d[4] = '\0';
      d[5] = '\0';
      write(UnixPipeOut, d, 6);

      len = strlen(SlavePTY) + 1;
      write(UnixPipeOut, &len, 2);
      write(UnixPipeOut, SlavePTY, len);

      if (command != 4) { /* New style has arg1 = termtype, arg2 = command */
        WriteLispStringToPipe(args[1]);
        WriteLispStringToPipe(args[2]);
      }

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      /* If successful, return job # */
      DBPRINT(("Pipe/fork result = %d.\n", d[3]));
      if (d[3] == 1) {
        /* Set up the IO not to block */
        fcntl(Master, F_SETFL, fcntl(Master, F_GETFL, 0) | O_NONBLOCK);

        UJ[Master].type = UJSHELL; /* so we can find them */
        UJ[Master].PID = (d[1] << 8) | d[2] | (d[4] << 16) | (d[5] << 24);
        printf("Shell job %d, PID = %d\n", Master, UJ[Master].PID);
        UJ[Master].status = -1;
        DBPRINT(("Forked pty in slot %d.\n", Master));
        return (GetSmallp(Master));
      } else {
        printf("Fork failed.\n");
        fflush(stdout);
        printf("d = %d, %d, %d, %d, %d, %d\n", d[0], d[1], d[2], d[3], d[4], d[5]);
        close(Master);
        return (NIL);
      }
    }

    case 5: /* Kill all the subprocesses */ close_unix_descriptors(); return (ATOM_T);

    case 6: /* Kill this subprocess */
      memset(d, 0, sizeof(d));
      d[0] = 'C';

      /* Get job # */
      N_GETNUMBER(args[1], dest, bad);
      d[1] = dest;

      d[3] = 1;
      write(UnixPipeOut, d, 6);

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      switch (UJ[dest].type) {
        case UJUNUSED:
          break;

        case UJSHELL:
          DBPRINT(("Kill 5 closing shell desc %d.\n", dest));
          close(dest);
          break;

        case UJPROCESS:
          DBPRINT(("Kill 5 closing process desc %d.\n", dest));
          close(dest);
          break;

        case UJSOCKET:
          /* close a socket; be sure and unlink the file handle */
          DBPRINT(("Kill 5 closing raw socket desc %d.\n", dest));
          close(dest);
          if (UJ[dest].pathname != NULL) {
            unlink(UJ[dest].pathname);
            free(UJ[dest].pathname);
            UJ[dest].pathname = NULL;
          } /* else return an error somehow... */
          break;

        case UJSOSTREAM:
          DBPRINT(("Kill 5 closing socket stream %d.\n", dest));
          close(dest);
          break;
      }

      UJ[dest].type = UJUNUSED;
      UJ[dest].PID = 0;
      return (ATOM_T);
    /* break; */

    case 7: /* Current job status */

      N_GETNUMBER(args[1], slot, bad); /* Get job # */
      wait_for_comm_processes();       /* Make sure we're up to date */

      if (UJ[slot].status == -1)
        return (ATOM_T);
      else
        return (GetSmallp(UJ[slot].status));

    case 8: /* Return largest supported command */ return (GetSmallp(15));

    case 9: /* Read buffer */
      /**********************************************************/
      /* 							    */
      /* NB that it is possible for the other end of the stream */
      /* to have terminated, and hence ForkedStatus != -1.	    */
      /* EVEN IF THERE ARE STILL CHARACTERS TO READ.	    */
      /* 							    */
      /**********************************************************/

      {
        DLword *bufp;
        int terno; /* holds errno thru sys calls after I/O fails */

        N_GETNUMBER(args[1], slot, bad);     /* Get job # */
        if (!valid_slot(slot)) return (NIL); /* No fd open; punt the read */

        bufp = (NativeAligned2FromLAddr(args[2])); /* User buffer */
        DBPRINT(("Read buffer slot %d, type is %d buffer LAddr 0x%x (native %p)\n", slot, UJ[slot].type, args[2], bufp));

        switch (UJ[slot].type) {
          case UJSHELL:
          case UJPROCESS:
          case UJSOSTREAM: dest = read(slot, bufp, 512);
#ifdef BYTESWAP
            word_swap_page(bufp, 128);
#endif /* BYTESWAP */

            if (dest > 0) { /* Got characters.  If debugging, print len &c */
              /* printf("got %d chars\n", dest); */
              return (GetSmallp(dest));
            }

            /* Something's amiss; update process status */
            DBPRINT(("Problem: Got status %d from read, errno %d.\n", dest, errno));
            wait_for_comm_processes(); /* make sure we're up to date */
            if (((dest == 0) || (errno == EINTR) || (errno == 0) || (errno == EAGAIN) ||
                 (errno == EWOULDBLOCK)) &&
                (UJ[slot].status == -1))
              /* No available chars, but other guy still running */
              return (ATOM_T);

            /* At this point, we either got an I/O error, or there */
            /* were no chars available and the other end has terminated. */
            /* Either way, signal EOF. */
            DBPRINT(("read failed; dest = %d, errno = %d, status = %d\n", dest, terno,
                     UJ[slot].status));
            DBPRINT(("Indicating EOF from PTY desc %d.\n", slot));
            return (NIL);

          case UJSOCKET:
          case UJUNUSED:
            return (NIL);
        }
      }

    case 10: /* Change window */
    {
      int rows, cols, pgrp, pty;
      struct winsize w;

      /* Get job #, rows, columns */
      N_GETNUMBER(args[1], slot, bad);
      N_GETNUMBER(args[2], rows, bad);
      N_GETNUMBER(args[3], cols, bad);

      if (valid_slot(slot) && (UJ[slot].type == UJSHELL) && (UJ[slot].status == -1)) {
        w.ws_row = rows;
        w.ws_col = cols;
        w.ws_xpixel = 0; /* not used */
        w.ws_ypixel = 0;
        pty = slot;
        /* Change window size, then
           notify process group of the change */
        if ((ioctl(pty, TIOCSWINSZ, &w) >= 0) &&
            ((pgrp = tcgetpgrp(pty)) >= 0) &&
            (killpg(pgrp, SIGWINCH) >= 0))
          return (ATOM_T);
        return (GetSmallp(errno));
      }

      return (NIL);
    }

    case 12: /* create Unix socket */

    {
      int sockFD;
      struct sockaddr_un sock;

      /* First open the socket */
      sockFD = socket(AF_UNIX, SOCK_STREAM, 0);
      if (sockFD < 0) {
        perror("socket open");
        return (NIL);
      }
      /* Then get a process slot and blit the pathname of the
         socket into it */
      /* need to type-check the string here */
      LispStringToCString(args[1], shcom, 2048);
      UJ[sockFD].pathname = malloc(strlen(shcom) + 1);
      strcpy(UJ[sockFD].pathname, shcom);
      /* Then bind it to the pathname, and get it	listening properly */

      sock.sun_family = AF_UNIX;
      strcpy(sock.sun_path, shcom);
      if (bind(sockFD, (struct sockaddr *)&sock, sizeof(struct sockaddr_un)) < 0) {
        close(sockFD);
        free(UJ[sockFD].pathname);
        UJ[sockFD].type = UJUNUSED;
        perror("binding Lisp sockets");
        return (NIL);
      }
      DBPRINT(("Socket %d bound to name %s.\n", sockFD, shcom));
      if (listen(sockFD, 1) < 0) perror("Listen");
      /* Set up the IO not to block */
      fcntl(sockFD, F_SETFL, fcntl(sockFD, F_GETFL, 0) | O_NONBLOCK);

      /* things seem sane, fill out the rest of the UJ slot and return */
      UJ[sockFD].status = -1;
      UJ[sockFD].PID = -1;
      UJ[sockFD].type = UJSOCKET;

      return (GetSmallp(sockFD));
    }

    case 13: /* try to accept */
    {
      /* returns file descriptor if successful,
         -1 if no connection available,
         NIL if failure */
      int sockFD, newFD;

      N_GETNUMBER(args[1], sockFD, bad);
      if (UJ[sockFD].type == UJSOCKET && UJ[sockFD].pathname != NULL) {
      /* sockFD SHOULD be non-blocking;
         but I'll time this out just in case */
      case13_lp:
        TIMEOUT(newFD = accept(sockFD, NULL, NULL));
        if (newFD < 0)
          if (errno == EINTR)
            goto case13_lp;
          else if (errno == EWOULDBLOCK)
            return (GetSmallp(-1));
          else {
            perror("Lisp socket accept");
            return (NIL);
          }
        else {
          UJ[newFD].status = -1;
          UJ[newFD].PID = -1;
          UJ[newFD].type = UJSOSTREAM;
          return (GetSmallp(newFD));
        }
      } else
        return (NIL);
    }

    case 14: /* return type of socket */
    {
      int streamFD;

      N_GETNUMBER(args[1], streamFD, bad);
      if (valid_slot(streamFD))
        return GetSmallp(UJ[streamFD].type);
      else
        return NIL;
    }

    case 15: /* Write buffer */
    {
      DLword *bufp;
      int i;
      N_GETNUMBER(args[1], slot, bad);              /* Get job # */
      bufp = (NativeAligned2FromLAddr(args[2])); /* User buffer */
      N_GETNUMBER(args[3], i, bad);                 /* # to write */
      DBPRINT(("Write buffer, type is %d\n", UJ[slot].type));

      switch (UJ[slot].type) {
        case UJSHELL:
        case UJPROCESS:
        case UJSOSTREAM:
#ifdef BYTESWAP
          word_swap_page(bufp, (i + 3) >> 2);
#endif /* BYTESWAP */

          dest = write(slot, bufp, i);
#ifdef BYTESWAP
          word_swap_page(bufp, (i + 3) >> 2);
#endif /* BYTESWAP */

          if (dest > 0) return (GetSmallp(dest));
          /* Something's amiss; update process status */
          wait_for_comm_processes(); /* make sure we're up to date */
          if (((dest == 0) || (errno == EWOULDBLOCK)) && (UJ[slot].status == -1))
            /* No room to write, but other guy still running */
            return (ATOM_T);
          /* At this point, we either got an I/O error, or there */
          /* were no chars available and the other end has terminated. */
          /* Either way, signal EOF. */
          DBPRINT(("Indicating write failure from PTY desc %d.\n", slot));
          return (NIL);

        case UJUNUSED:
        case UJSOCKET:
          return (NIL);
      }
    }

    default: return (NIL);
  }

bad:
  DBPRINT(("Bad input value."));
  return (NIL);
}